

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLGeometryLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::GeometryLoader::begin__mesh(GeometryLoader *this)

{
  COLLADAVersion CVar1;
  MeshLoader *this_00;
  IParserImpl14 *this_01;
  long lVar2;
  
  this_00 = (MeshLoader *)operator_new(0x270);
  MeshLoader::MeshLoader(this_00,(IFilePartLoader *)this,&this->mGeometryId,&this->mGeometryName);
  this->mMeshLoader = this_00;
  (this->super_FilePartLoader).super_IFilePartLoader.mPartLoader = (IFilePartLoader *)this_00;
  CVar1 = ((this->super_FilePartLoader).super_IFilePartLoader.mParserImpl)->mCOLLADAVersion;
  if (CVar1 == COLLADA_14) {
    this_01 = (IParserImpl14 *)operator_new(0x28);
    IParserImpl14::IParserImpl14(this_01);
    this_01[1].super_IParserImpl._vptr_IParserImpl = (_func_int **)this_00;
    (this_01->super_IParserImpl)._vptr_IParserImpl = (_func_int **)&PTR__IParserImpl14_009412f0;
    (this_01->super_ColladaParserAutoGen14)._vptr_ColladaParserAutoGen14 =
         (_func_int **)&PTR__MeshLoader14_00941480;
    lVar2 = 0x48;
  }
  else {
    if (CVar1 != COLLADA_15) {
      return true;
    }
    this_01 = (IParserImpl14 *)operator_new(0x28);
    IParserImpl15::IParserImpl15((IParserImpl15 *)this_01);
    this_01[1].super_IParserImpl._vptr_IParserImpl = (_func_int **)this_00;
    (this_01->super_IParserImpl)._vptr_IParserImpl = (_func_int **)&PTR__IParserImpl15_0094b988;
    (this_01->super_ColladaParserAutoGen14)._vptr_ColladaParserAutoGen14 =
         (_func_int **)&PTR__MeshLoader15_0094bb18;
    lVar2 = 0x50;
  }
  *(MeshLoader **)&this_01[1].super_IParserImpl.mCOLLADAVersion = this_00;
  (this->mMeshLoader->super_SourceArrayLoader).super_FilePartLoader.super_IFilePartLoader.
  mParserImpl = &this_01->super_IParserImpl;
  (**(code **)((long)(this->super_FilePartLoader).super_IFilePartLoader.super_ExtraDataLoader.
                     _vptr_ExtraDataLoader + lVar2))(this,&this_01->super_ColladaParserAutoGen14);
  return true;
}

Assistant:

bool GeometryLoader::begin__mesh()
	{
        mMeshLoader = new MeshLoader(this, mGeometryId, mGeometryName);
        setPartLoader(mMeshLoader);
        switch (this->getParserImpl()->getCOLLADAVersion())
        {
        case COLLADA_14:
            {
            MeshLoader14* meshloader14 = new MeshLoader14( mMeshLoader );
            mMeshLoader->setParserImpl(meshloader14);
            setParser(meshloader14);
            break;
            }
        case COLLADA_15:
            {
            MeshLoader15* meshloader15 = new MeshLoader15( mMeshLoader );
            mMeshLoader->setParserImpl(meshloader15);
            setParser(meshloader15);
            break;
            }
        default:
            break;
        }
		return true;
	}